

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int baud2i(speed_t baud)

{
  undefined4 local_c;
  speed_t baud_local;
  
  if (baud == 0) {
    local_c = 0;
  }
  else if (baud == 0xd) {
    local_c = 0x2580;
  }
  else if (baud == 0xe) {
    local_c = 0x4b00;
  }
  else if (baud == 0xf) {
    local_c = 0x9600;
  }
  else if (baud == 0x1001) {
    local_c = 0xe100;
  }
  else if (baud == 0x1002) {
    local_c = 0x1c200;
  }
  else if (baud == 0x1003) {
    local_c = 0x38400;
  }
  else if (baud == 0x1004) {
    local_c = 0x70800;
  }
  else if (baud == 0x1006) {
    local_c = 0x8ca00;
  }
  else if (baud == 0x1007) {
    local_c = 0xe1000;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

int baud2i(speed_t baud)
{
  switch (baud)
  {
    case B0:
      return 0;
    case B9600:
      return 9600;
    case B19200:
      return 19200;
    case B38400:
      return 38400;
#ifdef B57600
    case B57600:
      return 57600;
#endif  // B57600
#ifdef B128000
    case B128000:
      return 128000;
#endif  // B128000
#ifdef B115200
    case B115200:
      return 115200;
#endif  // B115200
#ifdef B230400
    case B230400:
      return 230400;
#endif  // B230400
#ifdef B460800
    case B460800:
      return 460800;
#endif  // B460800
#ifdef B576000
    case B576000:
      return 576000;
#endif  // B576000
#ifdef B921600
    case B921600:
      return 921600;
#endif  // B921600
  }
  return -1;
}